

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O3

LPWSTR lstrcpynW(LPWSTR lpString1,LPCWSTR lpString2,int iMaxLength)

{
  WCHAR WVar1;
  WCHAR *pWVar2;
  int iVar3;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpString2 == (LPCWSTR)0x0 || lpString1 == (LPWSTR)0x0) {
    lpString1 = (LPWSTR)0x0;
  }
  else {
    pWVar2 = lpString1;
    if (iMaxLength < 2) {
      if (iMaxLength != 1) {
        return lpString1;
      }
    }
    else {
      iVar3 = iMaxLength + 1;
      do {
        WVar1 = *lpString2;
        if (WVar1 == L'\0') break;
        lpString2 = lpString2 + 1;
        *pWVar2 = WVar1;
        pWVar2 = pWVar2 + 1;
        iVar3 = iVar3 + -1;
      } while (2 < iVar3);
    }
    *pWVar2 = L'\0';
  }
  return lpString1;
}

Assistant:

LPWSTR
PALAPI
lstrcpynW(
	  OUT LPWSTR lpString1,
	  IN LPCWSTR lpString2,
	  IN int iMaxLength)
{
    LPWSTR lpStart = lpString1;

    PERF_ENTRY(lstrcpynW);
    ENTRY("lstrcpynW (lpString1=%p, lpString2=%p (%S), iMaxLength=%d)\n",
              lpString1?lpString1:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, iMaxLength);

    if (lpString1 == NULL)
    {
        ERROR("invalid lpString1 argument\n");
        LOGEXIT("lstrcpynW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpynW);
        return NULL;
    }

    if (lpString2 == NULL)
    {
        ERROR("invalid lpString2 argument\n");
        LOGEXIT("lstrcpynW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpynW);
        return NULL;
    }

    /* copy source string to destination string */
    while(iMaxLength > 1 && *lpString2)
    {
        *lpString1++ = *lpString2++;
        iMaxLength--;
    }

    /* add terminating null */
    if (iMaxLength > 0)
    {
        *lpString1 = '\0';
    }

    LOGEXIT("lstrcpynW returning LPWSTR %p (%S)\n", lpStart, lpStart);
    PERF_EXIT(lstrcpynW);
    return lpStart;

}